

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

boundaries __thiscall fmt::v6::internal::fp::assign_with_boundaries<double>(fp *this,double d)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  int iVar5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  boundaries bVar10;
  
  uVar9 = (ulong)d & 0xfffffffffffff;
  this->f = uVar9;
  uVar8 = (uint)((ulong)d >> 0x34) & 0x7ff;
  if (uVar8 == 0) {
    iVar5 = -0x432;
  }
  else {
    this->f = uVar9 | 0x10000000000000;
    iVar5 = uVar8 - 0x433;
  }
  this->e = iVar5;
  uVar1 = this->f;
  uVar4 = uVar1 * 2 + 1;
  cVar3 = (char)iVar5;
  if ((uVar1 & 0x10000000000000) == 0) {
    lVar2 = 0x3f;
    if ((uVar4 & 0x1fffffffffffff) != 0) {
      for (; (uVar4 & 0x1fffffffffffff) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar4 = uVar4 << (~(byte)lVar2 + 0x36 & 0x3f);
    cVar6 = (((byte)lVar2 ^ 0x3f) - cVar3) + -9;
  }
  else {
    cVar6 = '\x01' - cVar3;
  }
  bVar7 = 1 < uVar8 && uVar9 == 0;
  bVar10.lower = (uVar1 << bVar7 + 1) + -1 << (cVar3 + cVar6 + ~bVar7 + 10U & 0x3f);
  bVar10.upper = uVar4 << 10;
  return bVar10;
}

Assistant:

boundaries assign_with_boundaries(Double d) {
    bool is_lower_closer = assign(d);
    fp lower =
        is_lower_closer ? fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    // 1 in normalize accounts for the exponent shift above.
    fp upper = normalize<1>(fp((f << 1) + 1, e - 1));
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }